

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# curltest.c
# Opt level: O2

int GetWebFiles(char *url1,char *url2)

{
  int iVar1;
  CURLcode CVar2;
  char *__src;
  char *pcVar3;
  CURL *curl;
  ulong uVar4;
  uint uVar5;
  char cVar6;
  char proxy [1024];
  
  __src = getenv("HTTP_PROXY");
  if (__src == (char *)0x0) {
    cVar6 = '\0';
  }
  else {
    pcVar3 = getenv("HTTP_PROXY_PORT");
    if (pcVar3 == (char *)0x0) {
      strcpy(proxy,__src);
    }
    else {
      sprintf(proxy,"%s:%s",__src,pcVar3);
    }
    cVar6 = '\x01';
    pcVar3 = getenv("HTTP_PROXY_TYPE");
    if (pcVar3 != (char *)0x0) {
      iVar1 = strcmp(pcVar3,"HTTP");
      if (iVar1 != 0) {
        iVar1 = strcmp(pcVar3,"SOCKS4");
        if (iVar1 == 0) {
          cVar6 = '\x02';
        }
        else {
          iVar1 = strcmp(pcVar3,"SOCKS5");
          cVar6 = (iVar1 == 0) * '\x02' + '\x01';
        }
      }
    }
  }
  curl = curl_easy_init();
  if (curl == (CURL *)0x0) {
    puts("Cannot create curl object");
    uVar5 = 1;
  }
  else {
    curl_easy_setopt(curl,CURLOPT_VERBOSE,1);
    curl_easy_setopt(curl,CURLOPT_HEADER,1);
    if (__src != (char *)0x0) {
      curl_easy_setopt(curl,CURLOPT_PROXY,proxy);
      uVar4 = 4;
      if (cVar6 != '\x02') {
        uVar4 = (ulong)((uint)(cVar6 == '\x03') * 5);
      }
      curl_easy_setopt(curl,CURLOPT_PROXYTYPE,uVar4);
    }
    curl_easy_setopt(curl,CURLOPT_URL,url1);
    CVar2 = curl_easy_perform(curl);
    if (CVar2 != CURLE_OK) {
      printf("Error fetching: %s\n",url1);
    }
    uVar5 = (uint)(CVar2 != CURLE_OK);
    curl_easy_cleanup(curl);
  }
  return uVar5;
}

Assistant:

int GetWebFiles(char *url1, char *url2)
{
  int retVal = 0;
  CURL *curl;
  CURLcode res;

  char proxy[1024];
  int proxy_type = 0;

  if ( getenv("HTTP_PROXY") )
    {
    proxy_type = 1;
    if (getenv("HTTP_PROXY_PORT") )
      {
      sprintf(proxy, "%s:%s", getenv("HTTP_PROXY"), getenv("HTTP_PROXY_PORT"));
      }
    else
      {
      sprintf(proxy, "%s", getenv("HTTP_PROXY"));
      }
    if ( getenv("HTTP_PROXY_TYPE") )
      {
      /* HTTP/SOCKS4/SOCKS5 */
      if ( strcmp(getenv("HTTP_PROXY_TYPE"), "HTTP") == 0 )
        {
        proxy_type = 1;
        }
      else if ( strcmp(getenv("HTTP_PROXY_TYPE"), "SOCKS4") == 0 )
        {
        proxy_type = 2;
        }
      else if ( strcmp(getenv("HTTP_PROXY_TYPE"), "SOCKS5") == 0 )
        {
        proxy_type = 3;
        }
      }
    }

  curl = curl_easy_init();
  if(curl) 
    {
    curl_easy_setopt(curl, CURLOPT_VERBOSE, 1);
    curl_easy_setopt(curl, CURLOPT_HEADER, 1);

    /* Using proxy */
    if ( proxy_type > 0 )
      {
      curl_easy_setopt(curl, CURLOPT_PROXY, proxy); 
      switch (proxy_type)
        {
        case 2:
          curl_easy_setopt(curl, CURLOPT_PROXYTYPE, CURLPROXY_SOCKS4);
          break;
        case 3:
          curl_easy_setopt(curl, CURLOPT_PROXYTYPE, CURLPROXY_SOCKS5);
          break;
        default:
          curl_easy_setopt(curl, CURLOPT_PROXYTYPE, CURLPROXY_HTTP);           
        }
      }

    /* get the first document */
    curl_easy_setopt(curl, CURLOPT_URL, url1);
    res = curl_easy_perform(curl);
    if ( res != 0 )
      {
      printf("Error fetching: %s\n", url1);
      retVal = 1;
      }

    /* get another document from the same server using the same
       connection */
    /* avoid warnings about url2 since below block is commented out: */
    (void) url2;
    /*
      curl_easy_setopt(curl, CURLOPT_URL, url2);
      res = curl_easy_perform(curl);
      if ( res != 0 )
      {
      printf("Error fetching: %s\n", url2);
      retVal = 1;
      }
    */

    /* always cleanup */
    curl_easy_cleanup(curl);
    }
  else
    {
    printf("Cannot create curl object\n");
    retVal = 1;
    }

  return retVal;
}